

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

VkDescriptorBufferInfo * __thiscall
vkt::ubo::anon_unknown_0::UniformBlockCaseInstance::addUniformData
          (VkDescriptorBufferInfo *__return_storage_ptr__,UniformBlockCaseInstance *this,
          deUint32 size,void *dataPtr)

{
  undefined1 *this_00;
  Context *context;
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  VkDevice device;
  DeviceInterface *vkd;
  Handle<(vk::HandleType)8> *pHVar1;
  Allocation *pAVar2;
  void *dst;
  VkDeviceSize offset;
  Unique<vk::Handle<(vk::HandleType)8>_> *this_01;
  SharedPtr<vk::Allocation> local_c8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_b8;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> local_98;
  VkDeviceMemory local_88;
  deUint32 local_6c;
  deUint64 local_68;
  undefined1 local_60 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  DeviceInterface *vk;
  VkDevice vkDevice;
  void *dataPtr_local;
  deUint32 size_local;
  UniformBlockCaseInstance *this_local;
  
  device = Context::getDevice((this->super_TestInstance).m_context);
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  this_00 = &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
             field_0x8;
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)this_00,(this->super_TestInstance).m_context,
               (ulong)size,0x10);
  context = (this->super_TestInstance).m_context;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this_00);
  local_68 = pHVar1->m_internal;
  local_6c = ::vk::MemoryRequirement::HostVisible.m_flags;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_60,context,
             (VkBuffer)local_68,::vk::MemoryRequirement::HostVisible);
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_60);
  dst = ::vk::Allocation::getHostPtr(pAVar2);
  ::deMemcpy(dst,dataPtr,(ulong)size);
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_60);
  local_88 = ::vk::Allocation::getMemory(pAVar2);
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_60);
  offset = ::vk::Allocation::getOffset(pAVar2);
  ::vk::flushMappedMemoryRange(vkd,device,local_88,offset,(ulong)size);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                       m_data.field_0x8);
  (__return_storage_ptr__->buffer).m_internal = pHVar1->m_internal;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->range = (ulong)size;
  this_01 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_b8,
             (Move *)&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                      m_data.field_0x8);
  data.deleter.m_deviceIface = local_b8.deleter.m_deviceIface;
  data.object.m_internal = local_b8.object.m_internal;
  data.deleter.m_device = local_b8.deleter.m_device;
  data.deleter.m_allocator = local_b8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(this_01,data);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
            (&local_98,this_01);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::push_back(&this->m_uniformBuffers,&local_98);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&local_98);
  pAVar2 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                     ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_60);
  de::SharedPtr<vk::Allocation>::SharedPtr(&local_c8,pAVar2);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  push_back(&this->m_uniformAllocs,&local_c8);
  de::SharedPtr<vk::Allocation>::~SharedPtr(&local_c8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_60);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
              field_0x8);
  return __return_storage_ptr__;
}

Assistant:

vk::VkDescriptorBufferInfo UniformBlockCaseInstance::addUniformData (deUint32 size, const void* dataPtr)
{
	const VkDevice					vkDevice			= m_context.getDevice();
	const DeviceInterface&			vk					= m_context.getDeviceInterface();

	Move<VkBuffer>					buffer	= createBuffer(m_context, size, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
	de::MovePtr<Allocation>			alloc	= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

	deMemcpy(alloc->getHostPtr(), dataPtr, size);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), size);

	const VkDescriptorBufferInfo			descriptor			=
	{
		*buffer,				// VkBuffer		buffer;
		0u,						// VkDeviceSize	offset;
		size,					// VkDeviceSize	range;

	};

	m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
	m_uniformAllocs.push_back(AllocationSp(alloc.release()));

	return descriptor;
}